

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformBlockTests.cpp
# Opt level: O2

void deqp::gles3::Functional::createBlockBasicTypeCases
               (TestCaseGroup *group,Context *context,char *name,VarType *type,deUint32 layoutFlags,
               int numInstances)

{
  TestNode *pTVar1;
  allocator<char> local_81;
  TestNode *local_80;
  VarType *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_80 = &group->super_TestNode;
  local_78 = type;
  pTVar1 = (TestNode *)operator_new(0xb0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,name,&local_81);
  std::operator+(&local_50,&local_70,"_vertex");
  BlockBasicTypeCase::BlockBasicTypeCase
            ((BlockBasicTypeCase *)pTVar1,context,local_50._M_dataplus._M_p,
             glcts::fixed_sample_locations_values + 1,local_78,layoutFlags | 0x100,numInstances);
  tcu::TestNode::addChild(local_80,pTVar1);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  pTVar1 = (TestNode *)operator_new(0xb0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,name,&local_81);
  std::operator+(&local_50,&local_70,"_fragment");
  BlockBasicTypeCase::BlockBasicTypeCase
            ((BlockBasicTypeCase *)pTVar1,context,local_50._M_dataplus._M_p,
             glcts::fixed_sample_locations_values + 1,local_78,layoutFlags | 0x200,numInstances);
  tcu::TestNode::addChild(local_80,pTVar1);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  if ((layoutFlags & 0x10) == 0) {
    pTVar1 = (TestNode *)operator_new(0xb0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,name,&local_81);
    std::operator+(&local_50,&local_70,"_both");
    BlockBasicTypeCase::BlockBasicTypeCase
              ((BlockBasicTypeCase *)pTVar1,context,local_50._M_dataplus._M_p,
               glcts::fixed_sample_locations_values + 1,local_78,layoutFlags | 0x300,numInstances);
    tcu::TestNode::addChild(local_80,pTVar1);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

static void createBlockBasicTypeCases (tcu::TestCaseGroup* group, Context& context, const char* name, const VarType& type, deUint32 layoutFlags, int numInstances = 0)
{
	group->addChild(new BlockBasicTypeCase(context, (string(name) + "_vertex").c_str(),		"", type, layoutFlags|DECLARE_VERTEX,					numInstances));
	group->addChild(new BlockBasicTypeCase(context, (string(name) + "_fragment").c_str(),	"", type, layoutFlags|DECLARE_FRAGMENT,					numInstances));

	if (!(layoutFlags & LAYOUT_PACKED))
		group->addChild(new BlockBasicTypeCase(context, (string(name) + "_both").c_str(),		"", type, layoutFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	numInstances));
}